

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::error(Parser *this,char *message)

{
  ostream *poVar1;
  ParseException *this_00;
  char *local_218;
  string local_210 [48];
  undefined1 local_1e0 [56];
  stringstream msg;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar1 = std::operator<<(local_198,"Parse error on line ");
  Token::Token((Token *)&local_218,&this->currentToken);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," column ");
  Token::Token((Token *)local_1e0,&this->currentToken);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,":\n\t");
  std::operator<<(poVar1,message);
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  std::__cxx11::string::~string(local_210);
  this_00 = (ParseException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  ParseException::ParseException(this_00,local_218);
  __cxa_throw(this_00,&ParseException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::error(const char *message) {
    std::stringstream msg;
    msg << "Parse error on line " << token().line <<  " column " << token().col << ":\n\t" << message;
    throw ParseException(msg.str().c_str());
}